

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O3

int expbuf_read(expbuf_t *buf,int fd)

{
  int iVar1;
  size_t in_RAX;
  int iVar2;
  size_t sz;
  size_t local_28;
  
  local_28 = in_RAX;
  iVar1 = read_nbytes(fd,&local_28,8);
  iVar2 = -1;
  if (iVar1 == 0) {
    expbuf_reserve(buf,local_28);
    iVar1 = read_nbytes(fd,buf->end,local_28);
    if (iVar1 == 0) {
      buf->end = buf->end + local_28;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int expbuf_read(struct expbuf_t *buf, int fd)
{
    size_t sz;

    if (read_nbytes(fd, &sz, sizeof(sz)) != 0)
        return -1;
    expbuf_reserve(buf, sz);
    if (read_nbytes(fd, buf->end, sz) != 0)
        return -1;
    buf->end += sz;
    return 0;
}